

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O1

_Bool translateRM(MCInst *mcInst,OperandSpecifier *operand,InternalInstruction *insn)

{
  EABase EVar1;
  _Bool _Var2;
  uint uVar3;
  ulong Val;
  int iVar4;
  int iVar5;
  
  _Var2 = true;
  switch(operand->type) {
  case '\b':
  case '\t':
  case '\n':
  case '\v':
  case '9':
  case ':':
  case ';':
  case '<':
  case '=':
  case '>':
  case '?':
  case '@':
  case 'A':
  case 'B':
  case 'E':
  case 'F':
  case 'K':
  case 'L':
  case 'N':
    EVar1 = insn->eaBase;
    if (EVar1 == EA_BASE_sib) {
      return true;
    }
    if (EVar1 == EA_BASE_sib64) {
      return true;
    }
    if (0xd2 < EVar1 - EA_REG_AL) {
      return true;
    }
    uVar3 = *(uint *)(&DAT_001f3c68 + (ulong)(EVar1 - EA_REG_AL) * 4);
    goto LAB_001a6316;
  default:
    goto switchD_001a5ef7_caseD_c;
  case '\x16':
  case '\x17':
  case '\x18':
  case '\x19':
  case '\x1a':
  case '\x1b':
  case '\x1c':
  case '\x1d':
  case '\x1e':
  case '\x1f':
  case ' ':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case 'M':
  case 'V':
    break;
  }
  switch(insn->eaBase) {
  case EA_BASE_NONE:
    if (insn->eaDisplacement == EA_DISP_NONE) {
      return true;
    }
    if (insn->mode == MODE_64BIT) {
      if (insn->prefix3 == 'g') {
        uVar3 = 0x1a;
      }
      else {
        uVar3 = 0x29;
      }
      break;
    }
    uVar3 = 0;
    MCOperand_CreateReg0(mcInst,0);
    Val = 1;
    goto LAB_001a62e3;
  case EA_BASE_BX_SI:
    uVar3 = 8;
    goto LAB_001a61db;
  case EA_BASE_BX_DI:
    uVar3 = 8;
    goto LAB_001a6157;
  case EA_BASE_BP_SI:
    uVar3 = 6;
LAB_001a61db:
    MCOperand_CreateReg0(mcInst,uVar3);
    Val = 1;
    uVar3 = 0x2d;
    goto LAB_001a62e3;
  case EA_BASE_BP_DI:
    uVar3 = 6;
LAB_001a6157:
    MCOperand_CreateReg0(mcInst,uVar3);
    Val = 1;
    uVar3 = 0xe;
    goto LAB_001a62e3;
  case EA_BASE_SI:
    uVar3 = 0x2d;
    break;
  case EA_BASE_DI:
    uVar3 = 0xe;
    break;
  case EA_BASE_BP:
    uVar3 = 6;
    break;
  case EA_BASE_BX:
    uVar3 = 8;
    break;
  case EA_BASE_R8W:
    uVar3 = 0xe2;
    break;
  case EA_BASE_R9W:
    uVar3 = 0xe3;
    break;
  case EA_BASE_R10W:
    uVar3 = 0xe4;
    break;
  case EA_BASE_R11W:
    uVar3 = 0xe5;
    break;
  case EA_BASE_R12W:
    uVar3 = 0xe6;
    break;
  case EA_BASE_R13W:
    uVar3 = 0xe7;
    break;
  case EA_BASE_R14W:
    uVar3 = 0xe8;
    break;
  case EA_BASE_R15W:
    uVar3 = 0xe9;
    break;
  case EA_BASE_EAX:
    uVar3 = 0x13;
    break;
  case EA_BASE_ECX:
    uVar3 = 0x16;
    break;
  case EA_BASE_EDX:
    uVar3 = 0x18;
    break;
  case EA_BASE_EBX:
    uVar3 = 0x15;
    break;
  case EA_BASE_sib:
  case EA_BASE_sib64:
    if (0x20 < (ulong)insn->sibBase) {
      return true;
    }
    MCOperand_CreateReg0(mcInst,*(uint *)(&DAT_001f3fb4 + (ulong)insn->sibBase * 4));
    uVar3 = MCInst_getOpcode(mcInst);
    if (((uVar3 - 0xeea < 0x14) && ((0xfc03fU >> (uVar3 - 0xeea & 0x1f) & 1) != 0)) ||
       (uVar3 - 0x13e2 < 0xc)) {
      iVar4 = (uint)(insn->addressSize != '\b') * 0x10 + insn->sibIndex + -0x21;
      iVar5 = 0x71;
      if (((0xe < uVar3 - 0xeee) || ((0x4801U >> (uVar3 - 0xeee & 0x1f) & 1) == 0)) &&
         ((9 < uVar3 - 0x13e3 || ((0x241U >> (uVar3 - 0x13e3 & 0x1f) & 1) == 0)))) {
        iVar5 = (uint)(((uVar3 == 0x13e8 || uVar3 == 0x13eb) || (uVar3 & 0xfffffffb) == 0x13e2) ||
                      ((uVar3 == 0xef8 || uVar3 == 0xeed) || (uVar3 & 0xffffffef) == 0xeeb)) * 0x20
                + 0x31;
      }
      if (insn->sibIndex == SIB_INDEX_NONE) {
        iVar4 = 4;
      }
      insn->sibIndex = iVar4 + iVar5;
    }
    if (insn->sibIndex == SIB_INDEX_NONE) {
      uVar3 = 0;
    }
    else {
      uVar3 = insn->sibIndex - SIB_INDEX_EAX;
      if (0x7f < uVar3) {
        return true;
      }
      uVar3 = *(uint *)(&DAT_001f3a68 + (ulong)uVar3 * 4);
    }
    Val = (ulong)insn->sibScale;
    goto LAB_001a62e3;
  case EA_BASE_EBP:
    uVar3 = 0x14;
    break;
  case EA_BASE_ESI:
    uVar3 = 0x1d;
    break;
  case EA_BASE_EDI:
    uVar3 = 0x17;
    break;
  case EA_BASE_R8D:
    uVar3 = 0xda;
    break;
  case EA_BASE_R9D:
    uVar3 = 0xdb;
    break;
  case EA_BASE_R10D:
    uVar3 = 0xdc;
    break;
  case EA_BASE_R11D:
    uVar3 = 0xdd;
    break;
  case EA_BASE_R12D:
    uVar3 = 0xde;
    break;
  case EA_BASE_R13D:
    uVar3 = 0xdf;
    break;
  case EA_BASE_R14D:
    uVar3 = 0xe0;
    break;
  case EA_BASE_R15D:
    uVar3 = 0xe1;
    break;
  case EA_BASE_RAX:
    uVar3 = 0x23;
    break;
  case EA_BASE_RCX:
    uVar3 = 0x26;
    break;
  case EA_BASE_RDX:
    uVar3 = 0x28;
    break;
  case EA_BASE_RBX:
    uVar3 = 0x25;
    break;
  case EA_BASE_RBP:
    uVar3 = 0x24;
    break;
  case EA_BASE_RSI:
    uVar3 = 0x2b;
    break;
  case EA_BASE_RDI:
    uVar3 = 0x27;
    break;
  case EA_BASE_R8:
    uVar3 = 0x62;
    break;
  case EA_BASE_R9:
    uVar3 = 99;
    break;
  case EA_BASE_R10:
    uVar3 = 100;
    break;
  case EA_BASE_R11:
    uVar3 = 0x65;
    break;
  case EA_BASE_R12:
    uVar3 = 0x66;
    break;
  case EA_BASE_R13:
    uVar3 = 0x67;
    break;
  case EA_BASE_R14:
    uVar3 = 0x68;
    break;
  case EA_BASE_R15:
    uVar3 = 0x69;
    break;
  default:
    goto switchD_001a5ef7_caseD_c;
  }
  MCOperand_CreateReg0(mcInst,uVar3);
  Val = 1;
  uVar3 = 0;
LAB_001a62e3:
  MCOperand_CreateImm0(mcInst,Val);
  MCOperand_CreateReg0(mcInst,uVar3);
  MCOperand_CreateImm0(mcInst,(long)insn->displacement);
  uVar3 = (uint)""[insn->segmentOverride];
LAB_001a6316:
  MCOperand_CreateReg0(mcInst,uVar3);
  _Var2 = false;
switchD_001a5ef7_caseD_c:
  return _Var2;
}

Assistant:

static bool translateRM(MCInst *mcInst, const OperandSpecifier *operand,
		InternalInstruction *insn)
{  
	switch (operand->type) {
		case TYPE_R8:
		case TYPE_R16:
		case TYPE_R32:
		case TYPE_R64:
		case TYPE_Rv:
		case TYPE_MM:
		case TYPE_MM32:
		case TYPE_MM64:
		case TYPE_XMM:
		case TYPE_XMM32:
		case TYPE_XMM64:
		case TYPE_XMM128:
		case TYPE_XMM256:
		case TYPE_XMM512:
		case TYPE_VK1:
		case TYPE_VK8:
		case TYPE_VK16:
		case TYPE_DEBUGREG:
		case TYPE_CONTROLREG:
			return translateRMRegister(mcInst, insn);
		case TYPE_M:
		case TYPE_M8:
		case TYPE_M16:
		case TYPE_M32:
		case TYPE_M64:
		case TYPE_M128:
		case TYPE_M256:
		case TYPE_M512:
		case TYPE_Mv:
		case TYPE_M32FP:
		case TYPE_M64FP:
		case TYPE_M80FP:
		case TYPE_M16INT:
		case TYPE_M32INT:
		case TYPE_M64INT:
		case TYPE_M1616:
		case TYPE_M1632:
		case TYPE_M1664:
		case TYPE_LEA:
			return translateRMMemory(mcInst, insn);
		default:
			//debug("Unexpected type for a R/M operand");
			return true;
	}
}